

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_srem(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  BtorSimBitVector *a_00;
  int *in_RDI;
  BtorSimBitVector *neg_urem;
  BtorSimBitVector *urem;
  BtorSimBitVector *cond_b;
  BtorSimBitVector *cond_a;
  BtorSimBitVector *neg_b;
  BtorSimBitVector *neg_a;
  BtorSimBitVector *sign_b;
  BtorSimBitVector *sign_a;
  BtorSimBitVector *not_b;
  BtorSimBitVector *res;
  BtorSimBitVector *in_stack_ffffffffffffff88;
  BtorSimBitVector *in_stack_ffffffffffffff90;
  BtorSimBitVector *in_stack_ffffffffffffff98;
  BtorSimBitVector *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  BtorSimBitVector *in_stack_ffffffffffffffb0;
  undefined8 local_18;
  
  if (*in_RDI == 1) {
    btorsim_bv_not(in_stack_ffffffffffffff90);
    local_18 = btorsim_bv_and(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    btorsim_bv_free((BtorSimBitVector *)0x13b29e);
  }
  else {
    btorsim_bv_slice(in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffffa8);
    btorsim_bv_slice(in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffffa8);
    btorsim_bv_neg(in_stack_ffffffffffffffa0);
    btorsim_bv_neg(in_stack_ffffffffffffffa0);
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff88);
    if (_Var1) {
      btorsim_bv_copy(in_stack_ffffffffffffff90);
    }
    else {
      btorsim_bv_copy(in_stack_ffffffffffffff90);
    }
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff88);
    if (_Var1) {
      a_00 = btorsim_bv_copy(in_stack_ffffffffffffff90);
    }
    else {
      a_00 = btorsim_bv_copy(in_stack_ffffffffffffff90);
    }
    btorsim_bv_urem(a_00,in_stack_ffffffffffffff88);
    btorsim_bv_neg(in_stack_ffffffffffffffa0);
    _Var1 = btorsim_bv_is_true(in_stack_ffffffffffffff88);
    if (_Var1) {
      local_18 = btorsim_bv_copy(a_00);
    }
    else {
      local_18 = btorsim_bv_copy(a_00);
    }
    btorsim_bv_free((BtorSimBitVector *)0x13b3df);
    btorsim_bv_free((BtorSimBitVector *)0x13b3e9);
    btorsim_bv_free((BtorSimBitVector *)0x13b3f3);
    btorsim_bv_free((BtorSimBitVector *)0x13b3fd);
    btorsim_bv_free((BtorSimBitVector *)0x13b407);
    btorsim_bv_free((BtorSimBitVector *)0x13b411);
    btorsim_bv_free((BtorSimBitVector *)0x13b41b);
    btorsim_bv_free((BtorSimBitVector *)0x13b425);
  }
  return local_18;
}

Assistant:

BtorSimBitVector *
btorsim_bv_srem (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    /* normalize a and b if necessary */
    cond_a   = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_a)
                                           : btorsim_bv_copy (a);
    cond_b   = btorsim_bv_is_true (sign_b) ? btorsim_bv_copy (neg_b)
                                           : btorsim_bv_copy (b);
    urem     = btorsim_bv_urem (cond_a, cond_b);
    neg_urem = btorsim_bv_neg (urem);
    res      = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_urem)
                                           : btorsim_bv_copy (urem);
    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}